

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::add_rule
          (filter_impl<std::array<unsigned_char,_4UL>_> *this,array<unsigned_char,_4UL> first,
          array<unsigned_char,_4UL> last,uint32_t flags)

{
  _Rb_tree_header *p_Var1;
  uint32_t a;
  bool bVar2;
  array<unsigned_char,_4UL> addr;
  iterator __x;
  iterator __x_00;
  _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
  _Var3;
  array<unsigned_char,_4UL> *__two;
  range *__one;
  uint32_t uVar4;
  array<unsigned_char,_4UL> first_local;
  array<unsigned_char,_4UL> last_local;
  range local_3c;
  array<unsigned_char,_4UL> local_34;
  
  first_local = first;
  last_local = last;
  range::range(&local_3c,first,0);
  __x = ::std::
        _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
        ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                       *)this,&local_3c);
  range::range(&local_3c,last,0);
  __x_00 = ::std::
           _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
           ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                          *)this,&local_3c);
  if (__x._M_node != (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    __x._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__x._M_node);
  }
  uVar4 = *(uint32_t *)&__x._M_node[1].field_0x4;
  _Var3 = ::std::
          prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                    (__x_00._M_node,1);
  a = *(uint32_t *)&_Var3._M_node[1].field_0x4;
  bVar2 = ::std::operator!=((array<unsigned_char,_4UL> *)(__x._M_node + 1),&first_local);
  if (uVar4 == flags || !bVar2) {
    if ((__x._M_node != (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
       && (_Var3 = ::std::
                   prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                             (__x._M_node,1), *(uint32_t *)&_Var3._M_node[1].field_0x4 == flags)) {
      __x._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__x._M_node);
      uVar4 = *(uint32_t *)&__x._M_node[1].field_0x4;
    }
  }
  else {
    range::range(&local_3c,first_local,flags);
    __x = ::std::
          _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
          ::_M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>
                    ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                      *)this,__x._M_node,&local_3c);
  }
  if (__x._M_node != __x_00._M_node) {
    _Var3 = ::std::
            next<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                      (__x._M_node,1);
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
    ::_M_erase_aux((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
                    *)this,(const_iterator)_Var3._M_node,(const_iterator)__x_00._M_node);
  }
  bVar2 = ::std::operator==((array<unsigned_char,_4UL> *)(__x._M_node + 1),&first_local);
  if (bVar2) {
    __x._M_node[1]._M_color = (_Rb_tree_color)first_local._M_elems;
    *(uint32_t *)&__x._M_node[1].field_0x4 = flags;
  }
  else if (uVar4 != flags) {
    range::range(&local_3c,first_local,flags);
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
    ::_M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>
              ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                *)this,(const_iterator)__x._M_node,&local_3c);
  }
  p_Var1 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__x_00._M_node == p_Var1) {
    __two = &local_34;
    local_34._M_elems[0] = 0xff;
    local_34._M_elems[1] = 0xff;
    local_34._M_elems[2] = 0xff;
    local_34._M_elems[3] = 0xff;
    __one = (range *)&last_local;
  }
  else {
    local_3c.start =
         minus_one<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)(__x_00._M_node + 1))
    ;
    __one = &local_3c;
    __two = &last_local;
  }
  bVar2 = ::std::operator!=(&__one->start,__two);
  if ((bVar2) && (a != flags)) {
    addr = plus_one<std::array<unsigned_char,4ul>>(&last_local);
    range::range(&local_3c,addr,a);
    __x_00 = ::std::
             _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
             ::_M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>
                       ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                         *)this,__x_00._M_node,&local_3c);
  }
  if (((_Rb_tree_header *)__x_00._M_node != p_Var1) &&
     (*(uint32_t *)&__x_00._M_node[1].field_0x4 == flags)) {
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
    ::erase_abi_cxx11_((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,4ul>>::range>>
                        *)this,(const_iterator)__x_00._M_node);
  }
  return;
}

Assistant:

void filter_impl<Addr>::add_rule(Addr first, Addr last, std::uint32_t const flags)
	{
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(first < last || first == last);

		auto i = m_access_list.upper_bound(first);
		auto j = m_access_list.upper_bound(last);

		if (i != m_access_list.begin()) --i;

		TORRENT_ASSERT(j != m_access_list.begin());
		TORRENT_ASSERT(j != i);

		std::uint32_t first_access = i->access;
		std::uint32_t last_access = std::prev(j)->access;

		if (i->start != first && first_access != flags)
		{
			i = m_access_list.insert(i, range(first, flags));
		}
		else if (i != m_access_list.begin() && std::prev(i)->access == flags)
		{
			--i;
			first_access = i->access;
		}
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(i != m_access_list.end());

		if (i != j) m_access_list.erase(std::next(i), j);
		if (i->start == first)
		{
			// This is an optimization over erasing and inserting a new element
			// here.
			// this const-cast is OK because we know that the new
			// start address will keep the set correctly ordered
			const_cast<Addr&>(i->start) = first;
			const_cast<std::uint32_t&>(i->access) = flags;
		}
		else if (first_access != flags)
		{
			m_access_list.insert(i, range(first, flags));
		}

		if ((j != m_access_list.end()
				&& minus_one(j->start) != last)
			|| (j == m_access_list.end()
				&& last != max_addr<Addr>()))
		{
			TORRENT_ASSERT(j == m_access_list.end() || last < minus_one(j->start));
			if (last_access != flags)
				j = m_access_list.insert(j, range(plus_one(last), last_access));
		}

		if (j != m_access_list.end() && j->access == flags) m_access_list.erase(j);
		TORRENT_ASSERT(!m_access_list.empty());
	}